

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O2

void mpiabi_unpublish_name_
               (char *service_name,MPIABI_Fint *info,char *port_name,MPIABI_Fint *ierror,
               size_t service_name_len,size_t port_name_len)

{
  mpi_unpublish_name_();
  return;
}

Assistant:

void mpiabi_unpublish_name_(
  const char * service_name,
  const MPIABI_Fint * info,
  const char * port_name,
  MPIABI_Fint * ierror,
  size_t service_name_len,
  size_t port_name_len
) {
  return mpi_unpublish_name_(
    service_name,
    info,
    port_name,
    ierror,
    service_name_len,
    port_name_len
  );
}